

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFilePostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  undefined8 __s;
  bool bVar1;
  ulong uVar2;
  allocator<char> local_55 [13];
  undefined1 local_48 [8];
  string configProp;
  char *postfix;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  configProp.field_2._8_8_ = 0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)local_48,config);
    std::__cxx11::string::operator+=((string *)local_48,"_POSTFIX");
    configProp.field_2._8_8_ = GetProperty(this,(string *)local_48);
    bVar1 = IsImported(this);
    if (((!bVar1) && (configProp.field_2._8_8_ != 0)) &&
       ((bVar1 = IsAppBundleOnApple(this), bVar1 || (bVar1 = IsFrameworkOnApple(this), bVar1)))) {
      configProp.field_2._8_8_ = 0;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  __s = configProp.field_2._8_8_;
  if (configProp.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)__s,local_55);
    std::allocator<char>::~allocator(local_55);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePostfix(const std::string& config) const
{
  const char* postfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    postfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (!this->IsImported() && postfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      postfix = nullptr;
    }
  }
  return postfix ? postfix : std::string();
}